

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O3

int32_t __thiscall helics::EndpointInfo::queueSize(EndpointInfo *this,Time maxTime)

{
  shared_mutex *__rwlock;
  _Elt_pointer puVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  int32_t iVar4;
  _Elt_pointer puVar5;
  
  __rwlock = &(this->message_queue).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  puVar2 = (this->message_queue).m_obj.
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar1 = (this->message_queue).m_obj.
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar2 == puVar1) {
    iVar4 = 0;
  }
  else {
    puVar5 = (this->message_queue).m_obj.
             super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar3 = (this->message_queue).m_obj.
              super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    iVar4 = 0;
    do {
      if (maxTime.internalTimeCode <
          (((puVar2->_M_t).
            super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode)
      break;
      puVar2 = puVar2 + 1;
      if (puVar2 == puVar5) {
        puVar2 = ppuVar3[1];
        ppuVar3 = ppuVar3 + 1;
        puVar5 = puVar2 + 0x40;
      }
      iVar4 = iVar4 + 1;
    } while (puVar2 != puVar1);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return iVar4;
}

Assistant:

int32_t EndpointInfo::queueSize(Time maxTime) const
{
    auto handle = message_queue.lock_shared();
    int32_t cnt = 0;
    for (const auto& msg : *handle) {
        if (msg->time <= maxTime) {
            ++cnt;
        } else {
            break;
        }
    }
    return cnt;
}